

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.cpp
# Opt level: O0

void __thiscall MppThread::MppThread(MppThread *this,MppThreadFunc func,void *ctx,char *name)

{
  MppMutexCond *local_30;
  char *name_local;
  void *ctx_local;
  MppThreadFunc func_local;
  MppThread *this_local;
  
  local_30 = this->mMutexCond;
  do {
    MppMutexCond::MppMutexCond(local_30);
    local_30 = local_30 + 1;
  } while (local_30 != (MppMutexCond *)this->mStatus);
  this->mFunction = func;
  this->mContext = ctx;
  this->mStatus[0] = MPP_THREAD_UNINITED;
  this->mStatus[1] = MPP_THREAD_RUNNING;
  this->mStatus[2] = MPP_THREAD_RUNNING;
  this->mStatus[3] = MPP_THREAD_RUNNING;
  if (name == (char *)0x0) {
    snprintf(this->mName,0xf,"mpp_thread");
  }
  else {
    strncpy(this->mName,name,0xf);
  }
  return;
}

Assistant:

MppThread::MppThread(MppThreadFunc func, void *ctx, const char *name)
    : mFunction(func),
      mContext(ctx)
{
    mStatus[THREAD_WORK]    = MPP_THREAD_UNINITED;
    mStatus[THREAD_INPUT]   = MPP_THREAD_RUNNING;
    mStatus[THREAD_OUTPUT]  = MPP_THREAD_RUNNING;
    mStatus[THREAD_CONTROL] = MPP_THREAD_RUNNING;

    if (name)
        strncpy(mName, name, sizeof(mName) - 1);
    else
        snprintf(mName, sizeof(mName) - 1, "mpp_thread");
}